

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeColSingletonPS::FreeColSingletonPS
          (FreeColSingletonPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *simplifier,int _j,int _i,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *slackVal,shared_ptr<soplex::Tolerances> *tols)

{
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  uint *puVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  pointer pnVar5;
  pointer pnVar6;
  Item *pIVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  cpp_dec_float<50U,_int,_void> local_288;
  cpp_dec_float<50U,_int,_void> local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  peVar4 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_290._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_290._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_290._M_pi)->_M_use_count = (local_290._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_290._M_pi)->_M_use_count = (local_290._M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar3 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003b3828;
  (this->super_PostStep).m_name = "FreeColSingleton";
  (this->super_PostStep).nCols = iVar3;
  (this->super_PostStep).nRows = iVar2;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_290);
  if (local_290._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FreeColSingletonPS_003b3ff8;
  this->m_j = _j;
  this->m_i = _i;
  this->m_old_j =
       (lp->
       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  this->m_old_i =
       (lp->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  if (lp->thesense == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&this->m_obj,lp,_j);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_248,lp,_j);
    *(ulong *)((this->m_obj).m_backend.data._M_elems + 8) =
         CONCAT35(local_248.data._M_elems[9]._1_3_,local_248.data._M_elems._32_5_);
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4) = local_248.data._M_elems._16_8_;
    *(ulong *)((this->m_obj).m_backend.data._M_elems + 6) =
         CONCAT35(local_248.data._M_elems[7]._1_3_,local_248.data._M_elems._24_5_);
    *(undefined8 *)(this->m_obj).m_backend.data._M_elems = local_248.data._M_elems._0_8_;
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2) = local_248.data._M_elems._8_8_;
    (this->m_obj).m_backend.exp = local_248.exp;
    (this->m_obj).m_backend.neg = local_248.neg;
    (this->m_obj).m_backend.fpclass = local_248.fpclass;
    (this->m_obj).m_backend.prec_elem = local_248.prec_elem;
    if (local_248.fpclass != cpp_dec_float_finite || (this->m_obj).m_backend.data._M_elems[0] != 0)
    {
      (this->m_obj).m_backend.neg = (bool)(local_248.neg ^ 1);
    }
  }
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 8) =
       *(undefined8 *)((slackVal->m_backend).data._M_elems + 8);
  uVar8 = *(undefined8 *)(slackVal->m_backend).data._M_elems;
  uVar9 = *(undefined8 *)((slackVal->m_backend).data._M_elems + 2);
  uVar10 = *(undefined8 *)((slackVal->m_backend).data._M_elems + 6);
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 4) =
       *(undefined8 *)((slackVal->m_backend).data._M_elems + 4);
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 6) = uVar10;
  *(undefined8 *)(this->m_lRhs).m_backend.data._M_elems = uVar8;
  *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 2) = uVar9;
  local_208.m_backend.exp = (slackVal->m_backend).exp;
  (this->m_lRhs).m_backend.exp = local_208.m_backend.exp;
  local_208.m_backend.neg = (slackVal->m_backend).neg;
  (this->m_lRhs).m_backend.neg = local_208.m_backend.neg;
  local_208.m_backend.fpclass = (slackVal->m_backend).fpclass;
  (this->m_lRhs).m_backend.fpclass = local_208.m_backend.fpclass;
  local_208.m_backend.prec_elem = (slackVal->m_backend).prec_elem;
  (this->m_lRhs).m_backend.prec_elem = local_208.m_backend.prec_elem;
  local_208.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((slackVal->m_backend).data._M_elems + 8);
  local_208.m_backend.data._M_elems._0_8_ = *(undefined8 *)(slackVal->m_backend).data._M_elems;
  local_208.m_backend.data._M_elems._8_8_ = *(undefined8 *)((slackVal->m_backend).data._M_elems + 2)
  ;
  local_208.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((slackVal->m_backend).data._M_elems + 4);
  local_208.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((slackVal->m_backend).data._M_elems + 6);
  pnVar5 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_148.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pnVar5[_i].m_backend.data._M_elems + 8)
  ;
  pnVar6 = pnVar5 + _i;
  local_148.m_backend.data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
  local_148.m_backend.data._M_elems[1] = (pnVar6->m_backend).data._M_elems[1];
  local_148.m_backend.data._M_elems[2] = (pnVar6->m_backend).data._M_elems[2];
  local_148.m_backend.data._M_elems[3] = (pnVar6->m_backend).data._M_elems[3];
  puVar1 = pnVar5[_i].m_backend.data._M_elems + 4;
  local_148.m_backend.data._M_elems[4] = *puVar1;
  local_148.m_backend.data._M_elems[5] = puVar1[1];
  local_148.m_backend.data._M_elems[6] = puVar1[2];
  local_148.m_backend.data._M_elems[7] = puVar1[3];
  local_148.m_backend.exp = pnVar5[_i].m_backend.exp;
  local_148.m_backend.neg = pnVar5[_i].m_backend.neg;
  local_148.m_backend.fpclass = pnVar5[_i].m_backend.fpclass;
  local_148.m_backend.prec_elem = pnVar5[_i].m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_68,this);
  bVar11 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_208,&local_148,&local_68);
  this->m_onLhs = bVar11;
  pnVar6 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_188.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pnVar6[_i].m_backend.data._M_elems + 8)
  ;
  local_188.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[_i].m_backend.data;
  local_188.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pnVar6[_i].m_backend.data._M_elems + 2);
  puVar1 = pnVar6[_i].m_backend.data._M_elems + 4;
  local_188.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_188.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_188.m_backend.exp = pnVar6[_i].m_backend.exp;
  local_188.m_backend.neg = pnVar6[_i].m_backend.neg;
  local_188.m_backend.fpclass = pnVar6[_i].m_backend.fpclass;
  local_188.m_backend.prec_elem = pnVar6[_i].m_backend.prec_elem;
  pnVar5 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pnVar5[_i].m_backend.data._M_elems + 8)
  ;
  pnVar6 = pnVar5 + _i;
  local_1c8.m_backend.data._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
  local_1c8.m_backend.data._M_elems[1] = (pnVar6->m_backend).data._M_elems[1];
  local_1c8.m_backend.data._M_elems[2] = (pnVar6->m_backend).data._M_elems[2];
  local_1c8.m_backend.data._M_elems[3] = (pnVar6->m_backend).data._M_elems[3];
  puVar1 = pnVar5[_i].m_backend.data._M_elems + 4;
  local_1c8.m_backend.data._M_elems[4] = *puVar1;
  local_1c8.m_backend.data._M_elems[5] = puVar1[1];
  local_1c8.m_backend.data._M_elems[6] = puVar1[2];
  local_1c8.m_backend.data._M_elems[7] = puVar1[3];
  local_1c8.m_backend.exp = pnVar5[_i].m_backend.exp;
  local_1c8.m_backend.neg = pnVar5[_i].m_backend.neg;
  local_1c8.m_backend.fpclass = pnVar5[_i].m_backend.fpclass;
  local_1c8.m_backend.prec_elem = pnVar5[_i].m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_a0,this);
  bVar11 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_188,&local_1c8,&local_a0);
  this->m_eqCons = bVar11;
  pIVar7 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar2 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[_i].idx;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_row)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b2428;
  (this->m_row).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_row,
             pIVar7[iVar2].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  this_00 = &(this->m_row).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(this_00,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)(pIVar7 + iVar2));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)&local_d8,lp,this->m_j);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_110,this_00,this->m_j);
  local_248.fpclass = cpp_dec_float_finite;
  local_248.prec_elem = 10;
  local_248.data._M_elems[0] = 0;
  local_248.data._M_elems[1] = 0;
  local_248.data._M_elems[2] = 0;
  local_248.data._M_elems[3] = 0;
  local_248.data._M_elems[4] = 0;
  local_248.data._M_elems[5] = 0;
  local_248.data._M_elems._24_5_ = 0;
  local_248.data._M_elems[7]._1_3_ = 0;
  local_248.data._M_elems._32_5_ = 0;
  local_248.data._M_elems[9]._1_3_ = 0;
  local_248.exp = 0;
  local_248.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_248,&local_d8,&local_110);
  local_288.fpclass = cpp_dec_float_finite;
  local_288.prec_elem = 10;
  local_288.data._M_elems[0] = 0;
  local_288.data._M_elems[1] = 0;
  local_288.data._M_elems[2] = 0;
  local_288.data._M_elems[3] = 0;
  local_288.data._M_elems[4] = 0;
  local_288.data._M_elems[5] = 0;
  local_288.data._M_elems._24_5_ = 0;
  local_288.data._M_elems[7]._1_3_ = 0;
  local_288.data._M_elems._32_5_ = 0;
  local_288.data._M_elems[9]._1_3_ = 0;
  local_288.exp = 0;
  local_288.neg = false;
  if (&local_288 != &(this->m_lRhs).m_backend) {
    uVar8 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 8);
    local_288.data._M_elems._32_5_ = SUB85(uVar8,0);
    local_288.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
    local_288.data._M_elems._0_8_ = *(undefined8 *)(this->m_lRhs).m_backend.data._M_elems;
    local_288.data._M_elems._8_8_ = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 2);
    local_288.data._M_elems._16_8_ = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 4);
    uVar8 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 6);
    local_288.data._M_elems._24_5_ = SUB85(uVar8,0);
    local_288.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
    local_288.exp = (this->m_lRhs).m_backend.exp;
    local_288.neg = (this->m_lRhs).m_backend.neg;
    local_288.fpclass = (this->m_lRhs).m_backend.fpclass;
    local_288.prec_elem = (this->m_lRhs).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_288,&local_248);
  (*(simplifier->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxSimplifier[0x11])(simplifier,&local_288);
  return;
}

Assistant:

FreeColSingletonPS(const SPxLPBase<R>& lp, SPxMainSM& simplifier, int _j, int _i,
                         R slackVal, std::shared_ptr<Tolerances> tols)
         : PostStep("FreeColSingleton", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_i(_i)
         , m_old_j(lp.nCols() - 1)
         , m_old_i(lp.nRows() - 1)
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_lRhs(slackVal)
         , m_onLhs(EQ(slackVal, lp.lhs(_i), this->epsilon()))
         , m_eqCons(EQ(lp.lhs(_i), lp.rhs(_i), this->epsilon()))
         , m_row(lp.rowVector(_i))
      {
         assert(m_row[m_j] != 0.0);
         simplifier.addObjoffset(m_lRhs * (lp.obj(m_j) / m_row[m_j]));
      }